

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::post_peer_info(torrent *this)

{
  int iVar1;
  undefined4 extraout_var;
  vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> v;
  undefined1 auStack_38 [24];
  element_type *peStack_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  auStack_38._16_8_ =
       (__uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
        )0x0;
  peStack_20 = (element_type *)0x0;
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  get_peer_info(this,(vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>
                      *)(auStack_38 + 0x10));
  iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  get_handle((torrent *)auStack_38);
  alert_manager::
  emplace_alert<libtorrent::peer_info_alert,libtorrent::torrent_handle,std::vector<libtorrent::v1_2::peer_info,std::allocator<libtorrent::v1_2::peer_info>>>
            ((alert_manager *)CONCAT44(extraout_var,iVar1),(torrent_handle *)auStack_38,
             (vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> *)
             (auStack_38 + 0x10));
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 8));
  ::std::vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>::~vector
            ((vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> *)
             (auStack_38 + 0x10));
  return;
}

Assistant:

void torrent::post_peer_info()
	{
		std::vector<peer_info> v;
		get_peer_info(&v);
		alerts().emplace_alert<peer_info_alert>(get_handle(), std::move(v));
	}